

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

MontgomeryPoint * ecc_montgomery_point_new(MontgomeryCurve *mc,mp_int *x)

{
  MontgomeryPoint *pMVar1;
  mp_int *pmVar2;
  
  pMVar1 = (MontgomeryPoint *)safemalloc(1,0x18,0);
  pMVar1->mc = mc;
  pMVar1->X = (mp_int *)0x0;
  pMVar1->Z = (mp_int *)0x0;
  pmVar2 = monty_import(mc->mc,x);
  pMVar1->X = pmVar2;
  pmVar2 = monty_identity(mc->mc);
  pmVar2 = mp_copy(pmVar2);
  pMVar1->Z = pmVar2;
  return pMVar1;
}

Assistant:

MontgomeryPoint *ecc_montgomery_point_new(MontgomeryCurve *mc, mp_int *x)
{
    MontgomeryPoint *mp = ecc_montgomery_point_new_empty(mc);
    mp->X = monty_import(mc->mc, x);
    mp->Z = mp_copy(monty_identity(mc->mc));
    return mp;
}